

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SqlGenerator.cpp
# Opt level: O1

void __thiscall SqlGenerator::~SqlGenerator(SqlGenerator *this)

{
  ~SqlGenerator(this);
  operator_delete(this);
  return;
}

Assistant:

SqlGenerator::~SqlGenerator()
{
}